

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

void init_parallel_tasks(work_item *tasks,work_item *init,_func_void_work_item_ptr_size_t *compute,
                        size_t task_size,size_t task_count)

{
  work_item *task;
  
  init->work_fn = compute;
  init->next = (work_item *)0x0;
  while (task_count != 0) {
    memcpy(tasks,init,task_size);
    if (task_count != 1) {
      tasks->next = (work_item *)((long)&tasks->work_fn + task_size);
    }
    tasks = (work_item *)((long)&tasks->work_fn + task_size);
    task_count = task_count - 1;
  }
  return;
}

Assistant:

static inline void init_parallel_tasks(
    struct work_item* tasks,
    struct work_item* init,
    void (*compute)(struct work_item*, size_t),
    size_t task_size, size_t task_count)
{
    init->work_fn = compute; 
    init->next    = NULL;
    for (size_t i = 0; i < task_count; ++i) {
        struct work_item* task = task_at(tasks, task_size, i);
        memcpy(task, init, task_size);
        if (i != task_count - 1)
            task->next = task_at(tasks, task_size, i + 1);
    }
}